

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

bool __thiscall clickhouse::Client::Impl::ReceiveException(Impl *this,bool rethrow)

{
  CodedInputStream *this_00;
  __uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> __ptr;
  QueryEvents *pQVar1;
  Impl *pIVar2;
  bool bVar3;
  Exception *buffer;
  unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> uVar4;
  ServerException *this_01;
  int iVar5;
  undefined7 in_register_00000031;
  bool has_nested;
  unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> e;
  uint64_t len;
  char local_59;
  _Head_base<0UL,_clickhouse::Exception_*,_false> local_58;
  ulong local_50;
  __uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> local_48;
  undefined4 local_3c;
  Impl *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000031,rethrow);
  buffer = (Exception *)operator_new(0x70);
  buffer->code = 0;
  (buffer->name)._M_dataplus = (_Alloc_hider)&(buffer->name).field_2;
  (buffer->name)._M_string_length = 0;
  (buffer->name).field_2._M_local_buf[0] = '\0';
  (buffer->display_text)._M_dataplus = (_Alloc_hider)&(buffer->display_text).field_2;
  (buffer->display_text)._M_string_length = 0;
  (buffer->display_text).field_2._M_local_buf[0] = '\0';
  (buffer->stack_trace)._M_dataplus = (_Alloc_hider)&(buffer->stack_trace).field_2;
  (buffer->stack_trace)._M_string_length = 0;
  (buffer->stack_trace).field_2._M_local_buf[0] = '\0';
  (buffer->nested)._M_t =
       (__uniq_ptr_data<clickhouse::Exception,_std::default_delete<clickhouse::Exception>,_true,_true>
        )0x0;
  this_00 = &this->input_;
  local_58._M_head_impl = buffer;
  local_38 = this;
  do {
    local_59 = '\0';
    bVar3 = CodedInputStream::ReadRaw(this_00,buffer,4);
    iVar5 = 1;
    if (bVar3) {
      bVar3 = CodedInputStream::ReadVarint64(this_00,&local_50);
      if ((bVar3) && (local_50 < 0x1000000)) {
        std::__cxx11::string::resize((ulong)&buffer->name,(char)local_50);
        bVar3 = CodedInputStream::ReadRaw(this_00,(buffer->name)._M_dataplus._M_p,local_50);
        if (bVar3) {
          bVar3 = CodedInputStream::ReadVarint64(this_00,&local_50);
          if ((bVar3) && (local_50 < 0x1000000)) {
            std::__cxx11::string::resize((ulong)&buffer->display_text,(char)local_50);
            bVar3 = CodedInputStream::ReadRaw
                              (this_00,(buffer->display_text)._M_dataplus._M_p,local_50);
            if (bVar3) {
              bVar3 = CodedInputStream::ReadVarint64(this_00,&local_50);
              if ((bVar3) && (local_50 < 0x1000000)) {
                std::__cxx11::string::resize((ulong)&buffer->stack_trace,(char)local_50);
                bVar3 = CodedInputStream::ReadRaw
                                  (this_00,(buffer->stack_trace)._M_dataplus._M_p,local_50);
                if (bVar3) {
                  bVar3 = CodedInputStream::ReadRaw(this_00,&local_59,1);
                  if ((bVar3) && (iVar5 = 2, local_59 == '\x01')) {
                    uVar4._M_t.
                    super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                    .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
                         (__uniq_ptr_data<clickhouse::Exception,_std::default_delete<clickhouse::Exception>,_true,_true>
                          )operator_new(0x70);
                    *(undefined4 *)
                     uVar4._M_t.
                     super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                     .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl = 0;
                    *(undefined4 **)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl + 8)
                         = (undefined4 *)
                           ((long)uVar4._M_t.
                                  super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                                  .super__Head_base<0UL,_clickhouse::Exception_*,_false>.
                                  _M_head_impl + 0x18);
                    *(undefined8 *)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x10) = 0;
                    *(undefined1 *)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x18) = 0;
                    *(undefined4 **)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x28) = (undefined4 *)
                             ((long)uVar4._M_t.
                                    super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                                    .super__Head_base<0UL,_clickhouse::Exception_*,_false>.
                                    _M_head_impl + 0x38);
                    *(undefined8 *)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x30) = 0;
                    *(undefined1 *)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x38) = 0;
                    *(undefined4 **)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x48) = (undefined4 *)
                             ((long)uVar4._M_t.
                                    super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                                    .super__Head_base<0UL,_clickhouse::Exception_*,_false>.
                                    _M_head_impl + 0x58);
                    *(undefined8 *)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x50) = 0;
                    *(undefined1 *)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x58) = 0;
                    *(undefined8 *)
                     ((long)uVar4._M_t.
                            super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                            .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl +
                     0x68) = 0;
                    __ptr._M_t.
                    super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                    .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
                         *(tuple<clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                           *)&(buffer->nested)._M_t;
                    (buffer->nested)._M_t =
                         uVar4._M_t.
                         super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                         .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl;
                    if ((__uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                         )__ptr._M_t.
                          super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                          .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl !=
                        (__uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                         )0x0) {
                      std::default_delete<clickhouse::Exception>::operator()
                                ((default_delete<clickhouse::Exception> *)&buffer->nested,
                                 (Exception *)
                                 __ptr._M_t.
                                 super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                                 .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl
                                );
                    }
                    buffer = *(Exception **)
                              &((default_delete<clickhouse::Exception> *)&buffer->nested)->field_0x0
                    ;
                    iVar5 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    pIVar2 = local_38;
  } while (iVar5 == 0);
  if (iVar5 == 2) {
    pQVar1 = local_38->events_;
    if (pQVar1 != (QueryEvents *)0x0) {
      (*pQVar1->_vptr_QueryEvents[5])(pQVar1,local_58._M_head_impl);
    }
    if (((char)local_3c != '\0') || (bVar3 = true, (pIVar2->options_).rethrow_exceptions == true)) {
      this_01 = (ServerException *)__cxa_allocate_exception(0x18);
      local_48._M_t.
      super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>.
      super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl =
           (tuple<clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>)
           (tuple<clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>)
           local_58._M_head_impl;
      local_58._M_head_impl = (Exception *)0x0;
      ServerException::ServerException
                (this_01,(unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                          *)&local_48);
      __cxa_throw(this_01,&ServerException::typeinfo,ServerException::~ServerException);
    }
  }
  else {
    bVar3 = false;
  }
  if (local_58._M_head_impl != (Exception *)0x0) {
    std::default_delete<clickhouse::Exception>::operator()
              ((default_delete<clickhouse::Exception> *)&local_58,local_58._M_head_impl);
  }
  return bVar3;
}

Assistant:

bool Client::Impl::ReceiveException(bool rethrow) {
    std::unique_ptr<Exception> e(new Exception);
    Exception* current = e.get();

    do {
        bool has_nested = false;

        if (!WireFormat::ReadFixed(&input_, &current->code)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->name)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->display_text)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->stack_trace)) {
            return false;
        }
        if (!WireFormat::ReadFixed(&input_, &has_nested)) {
            return false;
        }

        if (has_nested) {
            current->nested.reset(new Exception);
            current = current->nested.get();
        } else {
            break;
        }
    } while (true);

    if (events_) {
        events_->OnServerException(*e);
    }

    if (rethrow || options_.rethrow_exceptions) {
        throw ServerException(std::move(e));
    }

    return true;
}